

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O3

void tcmalloc::ThreadCache::RecomputePerThreadCacheSize(void)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  
  uVar1 = overall_thread_cache_size_;
  uVar4 = 1;
  if (1 < (int)thread_heap_count_) {
    uVar4 = (ulong)thread_heap_count_;
  }
  lVar3 = 0;
  uVar2 = min_per_thread_cache_size_;
  if (min_per_thread_cache_size_ < overall_thread_cache_size_ / uVar4) {
    uVar2 = overall_thread_cache_size_ / uVar4;
  }
  if (0x3fffff < uVar2) {
    uVar2 = 0x400000;
  }
  if (thread_heaps_ != 0) {
    dVar7 = ((double)CONCAT44(0x45300000,(int)(per_thread_cache_size_ >> 0x20)) -
            1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)per_thread_cache_size_) - 4503599627370496.0);
    if (dVar7 <= 1.0) {
      dVar7 = 1.0;
    }
    lVar3 = 0;
    lVar5 = thread_heaps_;
    do {
      iVar6 = *(int *)(lVar5 + 0x1004);
      if ((double)(long)uVar2 / dVar7 < 1.0) {
        iVar6 = (int)((double)iVar6 * ((double)(long)uVar2 / dVar7));
        *(int *)(lVar5 + 0x1004) = iVar6;
      }
      lVar3 = lVar3 + iVar6;
      lVar5 = *(long *)(lVar5 + 0x1020);
    } while (lVar5 != 0);
  }
  unclaimed_cache_space_ = uVar1 - lVar3;
  per_thread_cache_size_ = uVar2;
  return;
}

Assistant:

void ThreadCache::RecomputePerThreadCacheSize() {
  // Divide available space across threads
  int n = thread_heap_count_ > 0 ? thread_heap_count_ : 1;
  size_t space = overall_thread_cache_size_ / n;

  size_t min_size = min_per_thread_cache_size_.load(std::memory_order_relaxed);
  // Limit to allowed range
  if (space < min_size) space = min_size;
  if (space > kMaxThreadCacheSize) space = kMaxThreadCacheSize;

  double ratio = space / std::max<double>(1, per_thread_cache_size_);
  size_t claimed = 0;
  for (ThreadCache* h = thread_heaps_; h != nullptr; h = h->next_) {
    // Increasing the total cache size should not circumvent the
    // slow-start growth of max_size_.
    if (ratio < 1.0) {
      h->SetMaxSize(h->max_size_ * ratio);
    }
    claimed += h->max_size_;
  }
  unclaimed_cache_space_ = overall_thread_cache_size_ - claimed;
  per_thread_cache_size_ = space;
}